

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_file_hash.c
# Opt level: O2

ion_status_t oafh_insert(ion_file_hashmap_t *hash_map,ion_key_t key,ion_value_t value)

{
  int iVar1;
  ulong uVar2;
  char cVar3;
  int iVar4;
  byte *__ptr;
  ion_status_t iVar5;
  FILE *__s;
  byte *__dest;
  size_t __n;
  size_t __size;
  uint uVar9;
  ulong uVar10;
  uint local_48;
  ion_status_t iVar6;
  ion_status_t iVar7;
  ion_status_t iVar8;
  
  iVar4 = (*hash_map->compute_hash)(hash_map,key,(hash_map->super).record.key_size);
  uVar2 = (long)iVar4 % (long)hash_map->map_size;
  uVar10 = uVar2 & 0xffffffff;
  iVar4 = (hash_map->super).record.key_size;
  iVar1 = (hash_map->super).record.value_size;
  local_48 = iVar1 + iVar4;
  __size = (long)iVar1 + (long)iVar4 + 1;
  __ptr = (byte *)malloc(__size);
  iVar4 = 0;
  fseek((FILE *)hash_map->file,(long)((int)uVar2 * (int)__size),0);
  __dest = __ptr + 1;
  do {
    if (iVar4 == hash_map->map_size) {
      free(__ptr);
      iVar5.error = '\x03';
      iVar5._1_3_ = 0;
      iVar5.count = 0;
      return iVar5;
    }
    fread(__ptr,__size,1,(FILE *)hash_map->file);
    if (*__ptr == 0xfd) {
      cVar3 = (*(hash_map->super).compare)(__dest,key,(hash_map->super).record.key_size);
      if (cVar3 == '\0') {
        if (hash_map->write_concern != '\0') {
          if (hash_map->write_concern == '\x01') {
            free(__ptr);
            iVar7.error = '\x02';
            iVar7._1_3_ = 0;
            iVar7.count = 0;
            return iVar7;
          }
          free(__ptr);
          iVar6.error = '\a';
          iVar6._1_3_ = 0;
          iVar6.count = 0;
          return iVar6;
        }
        fseek((FILE *)hash_map->file,(long)(int)((hash_map->super).record.key_size - local_48),1);
        __size = (size_t)(hash_map->super).record.value_size;
        __s = (FILE *)hash_map->file;
        goto LAB_00108435;
      }
    }
    else if (*__ptr - 0xfe < 2) {
      fseek((FILE *)hash_map->file,(long)(int)~local_48,1);
      *__ptr = 0xfd;
      __n = (size_t)(hash_map->super).record.key_size;
      memcpy(__dest,key,__n);
      memcpy(__dest + __n,value,(long)(hash_map->super).record.value_size);
      __s = (FILE *)hash_map->file;
      value = __ptr;
LAB_00108435:
      fwrite(value,__size,1,__s);
      free(__ptr);
      iVar8.error = '\0';
      iVar8._1_3_ = 0;
      iVar8.count = 1;
      return iVar8;
    }
    uVar9 = (int)uVar10 + 1;
    uVar10 = (ulong)uVar9;
    if (hash_map->map_size <= (int)uVar9) {
      rewind((FILE *)hash_map->file);
      uVar10 = 0;
    }
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

ion_status_t
oafh_insert(
	ion_file_hashmap_t	*hash_map,
	ion_key_t			key,
	ion_value_t			value
) {
	ion_hash_t hash = hash_map->compute_hash(hash_map, key, hash_map->super.record.key_size);	/* compute hash value for given key */

	int loc			= oafh_get_location(hash, hash_map->map_size);

	/* Scan until find an empty location - oah_insert if found */
	int count		= 0;

	ion_hash_bucket_t *item;

	int record_size = hash_map->super.record.key_size + hash_map->super.record.value_size + SIZEOF(STATUS);

	item = malloc(record_size);

	/* set file position */
	fseek(hash_map->file, loc * record_size, SEEK_SET);

	while (count != hash_map->map_size) {
		fread(item, record_size, 1, hash_map->file);
#if ION_DEBUG
		DUMP((int) ftell(hash_map->file), "%i");
#endif

		if (item->status == ION_IN_USE) {
			/* if a cell is in use, need to key to */

			if (hash_map->super.compare(item->data, key, hash_map->super.record.key_size) == ION_IS_EQUAL) {
				if (hash_map->write_concern == wc_insert_unique) {
					/* allow unique entries only */
					free(item);
					return ION_STATUS_ERROR(err_duplicate_key);
				}
				else if (hash_map->write_concern == wc_update) {
					/* allows for values to be updated											// */
					/* backup and write */
					fseek(hash_map->file, SIZEOF(STATUS) + hash_map->super.record.key_size - record_size, SEEK_CUR);
#if ION_DEBUG
					DUMP((int) ftell(hash_map->file), "%i");
					DUMP(value, "%s");
#endif
					fwrite(value, hash_map->super.record.value_size, 1, hash_map->file);
					free(item);
					return ION_STATUS_OK(1);
				}
				else {
					free(item);
					return ION_STATUS_ERROR(err_file_write_error);	/* there is a configuration issue with write concern */
				}
			}
		}
		else if ((item->status == ION_EMPTY) || (item->status == ION_DELETED)) {
			/* problem is here with base types as it is just an array of data.  Need better way */
			/* printf("empty\n"); */
			fseek(hash_map->file, -record_size, SEEK_CUR);
#if ION_DEBUG
			DUMP((int) ftell(hash_map->file), "%i");
#endif
			item->status = ION_IN_USE;
			memcpy(item->data, key, (hash_map->super.record.key_size));
			memcpy(item->data + hash_map->super.record.key_size, value, (hash_map->super.record.value_size));
			fwrite(item, record_size, 1, hash_map->file);
			free(item);

			return ION_STATUS_OK(1);
		}

		loc++;

		if (loc >= hash_map->map_size) {
			/* Perform wrapping */
			loc = 0;
			/* rewind the file */
			frewind(hash_map->file);
		}

#if ION_DEBUG
		printf("checking location %i\n", loc);
#endif
		count++;
	}

#if ION_DEBUG
	printf("Hash table full.  Insert not done");
#endif
	free(item);
	return ION_STATUS_ERROR(err_max_capacity);
}